

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QDate QDate::fromString(QStringView string,DateFormat format)

{
  storage_type_conflict sVar1;
  bool bVar2;
  Category CVar3;
  qlonglong qVar4;
  qlonglong qVar5;
  int iVar6;
  long lVar7;
  int in_R8D;
  long in_FS_OFFSET;
  QStringView string_00;
  QStringView string_01;
  ParsedRfcDateTime PVar8;
  ParsedInt PVar9;
  ParsedInt PVar10;
  ParsedInt PVar11;
  QStringView text;
  QStringView text_00;
  QStringView text_01;
  bool ok;
  iterator it;
  byte local_f9;
  undefined1 local_f8 [32];
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  QDate local_b8;
  QStringTokenizerBase<QStringView,_QChar> local_b0;
  QVLABase<QStringView> local_90;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  text.m_data = string.m_data;
  lVar7 = string.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (lVar7 != 0) {
    if (format != ISODate) {
      if (format == RFC2822Date) {
        PVar8 = rfcDateImpl(string);
        local_b8 = PVar8.date.jd;
        goto LAB_00346207;
      }
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_90.super_QVLABaseBase.a = 4;
      local_90.super_QVLABaseBase.s = 0;
      local_b0.super_QStringTokenizerBaseBase.m_sb.
      super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
      super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
           (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x1;
      local_b0.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
      local_b0.m_needle.ucs = L' ';
      local_b0._26_6_ = 0xaaaaaaaaaaaa;
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b0.m_haystack.m_size = lVar7;
      local_b0.m_haystack.m_data = text.m_data;
      local_90.super_QVLABaseBase.ptr = &local_78;
      QStringTokenizerBase<QStringView,_QChar>::iterator::iterator((iterator *)local_f8,&local_b0);
      iVar6 = 4;
      do {
        if (local_f8[0x18] == false) break;
        QVLABase<QStringView>::emplace_back_impl<QStringView_const&>
                  (&local_90,4,&local_78,(QStringView *)(local_f8 + 8));
        QStringTokenizerBase<QStringView,_QChar>::iterator::advance((iterator *)local_f8);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      if ((local_90.super_QVLABaseBase.s == 4) && (local_f8[0x18] != true)) {
        local_f9 = 0;
        string_00.m_data = (storage_type_conflict *)&local_f9;
        string_00.m_size = (qsizetype)*(undefined1 **)((long)local_90.super_QVLABaseBase.ptr + 0x38)
        ;
        qVar4 = QString::toIntegral_helper
                          (*(QString **)((long)local_90.super_QVLABaseBase.ptr + 0x30),string_00,
                           (bool *)0xa,in_R8D);
        if (((int)qVar4 != qVar4) || ((local_f9 & 1) == 0)) goto LAB_003461bf;
        string_01.m_data = (storage_type_conflict *)&local_f9;
        string_01.m_size = (qsizetype)*(undefined1 **)((long)local_90.super_QVLABaseBase.ptr + 0x28)
        ;
        qVar5 = QString::toIntegral_helper
                          (*(QString **)((long)local_90.super_QVLABaseBase.ptr + 0x20),string_01,
                           (bool *)0xa,in_R8D);
        if (((((int)qVar5 != qVar5) || (qVar5 == 0)) || (local_f9 == 0)) ||
           (iVar6 = fromShortMonthName(*(QStringView *)
                                        ((long)local_90.super_QVLABaseBase.ptr + 0x10)), iVar6 == -1
           )) goto LAB_003461bf;
        QDate(&local_b8,(int)qVar4,iVar6,(int)qVar5);
      }
      else {
LAB_003461bf:
        local_b8.jd = -0x8000000000000000;
      }
      if ((undefined1 **)local_90.super_QVLABaseBase.ptr != &local_78) {
        QtPrivate::sizedFree(local_90.super_QVLABaseBase.ptr,local_90.super_QVLABaseBase.a << 4);
      }
      goto LAB_00346207;
    }
    if ((((9 < lVar7) && (bVar2 = QChar::isPunct((uint)(ushort)text.m_data[4]), bVar2)) &&
        (bVar2 = QChar::isPunct((uint)(ushort)text.m_data[7]), bVar2)) &&
       ((lVar7 == 10 ||
        ((sVar1 = text.m_data[10], 9 < (ushort)sVar1 - 0x30 &&
         (((ushort)sVar1 < 0x80 ||
          (CVar3 = QChar::category((uint)(ushort)sVar1), CVar3 != Number_DecimalDigit)))))))) {
      text.m_size = 4;
      PVar9 = anon_unknown.dwarf_dcedf7::readInt(text);
      text_00.m_data = text.m_data + 5;
      text_00.m_size = 2;
      PVar10 = anon_unknown.dwarf_dcedf7::readInt(text_00);
      text_01.m_data = text.m_data + 8;
      text_01.m_size = 2;
      PVar11 = anon_unknown.dwarf_dcedf7::readInt(text_01);
      if (0 < PVar11.used && ((0 < PVar10.used && 0 < PVar9.used) && PVar9.result - 1 < 9999)) {
        QDate(&local_b8,(int)PVar9.result,(int)PVar10.result,(int)PVar11.result);
        goto LAB_00346207;
      }
    }
  }
  local_b8.jd = -0x8000000000000000;
LAB_00346207:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDate)local_b8.jd;
}

Assistant:

QDate QDate::fromString(QStringView string, Qt::DateFormat format)
{
    if (string.isEmpty())
        return QDate();

    switch (format) {
    case Qt::RFC2822Date:
        return rfcDateImpl(string).date;
    default:
    case Qt::TextDate: {
        // Documented as "ddd MMM d yyyy"
        QVarLengthArray<QStringView, 4> parts;
        auto tokens = string.tokenize(u' ', Qt::SkipEmptyParts);
        auto it = tokens.begin();
        for (int i = 0; i < 4 && it != tokens.end(); ++i, ++it)
            parts.emplace_back(*it);

        if (parts.size() != 4 || it != tokens.end())
            return QDate();

        bool ok = false;
        int year = parts.at(3).toInt(&ok);
        int day = ok ? parts.at(2).toInt(&ok) : 0;
        if (!ok || !day)
            return QDate();

        const int month = fromShortMonthName(parts.at(1));
        if (month == -1) // Month name matches no English or localised name.
            return QDate();

        return QDate(year, month, day);
        }
    case Qt::ISODate:
        // Semi-strict parsing, must be long enough and have punctuators as separators
        if (string.size() >= 10 && string[4].isPunct() && string[7].isPunct()
                && (string.size() == 10 || !string[10].isDigit())) {
            const ParsedInt year = readInt(string.first(4));
            const ParsedInt month = readInt(string.sliced(5, 2));
            const ParsedInt day = readInt(string.sliced(8, 2));
            if (year.ok() && year.result > 0 && year.result <= 9999 && month.ok() && day.ok())
                return QDate(year.result, month.result, day.result);
        }
        break;
    }
    return QDate();
}